

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

_Bool smtp_endofresp(connectdata *conn,char *line,size_t len,int *resp)

{
  int iVar1;
  long slnum;
  char local_3f [6];
  byte local_39;
  char tmpline [6];
  anon_union_240_10_26c073a1_for_proto *paStack_38;
  _Bool result;
  smtp_conn *smtpc;
  int *resp_local;
  size_t len_local;
  char *line_local;
  connectdata *conn_local;
  
  paStack_38 = &conn->proto;
  local_39 = 0;
  if ((((len < 4) || (iVar1 = Curl_isdigit((uint)(byte)*line), iVar1 == 0)) ||
      (iVar1 = Curl_isdigit((uint)(byte)line[1]), iVar1 == 0)) ||
     (iVar1 = Curl_isdigit((uint)(byte)line[2]), iVar1 == 0)) {
    conn_local._7_1_ = false;
  }
  else {
    if ((line[3] == ' ') || (len == 5)) {
      local_39 = 1;
      memset(local_3f,0,6);
      iVar1 = 3;
      if (len == 5) {
        iVar1 = 5;
      }
      memcpy(local_3f,line,(long)iVar1);
      slnum = strtol(local_3f,(char **)0x0,10);
      iVar1 = curlx_sltosi(slnum);
      *resp = iVar1;
      if (*resp == 1) {
        *resp = 0;
      }
    }
    else if ((line[3] == '-') &&
            (((paStack_38->imapc).state == IMAP_CAPABILITY ||
             ((paStack_38->imapc).state == IMAP_LIST)))) {
      local_39 = 1;
      *resp = 1;
    }
    conn_local._7_1_ = (_Bool)(local_39 & 1);
  }
  return conn_local._7_1_;
}

Assistant:

static bool smtp_endofresp(struct connectdata *conn, char *line, size_t len,
                           int *resp)
{
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  bool result = FALSE;

  /* Nothing for us */
  if(len < 4 || !ISDIGIT(line[0]) || !ISDIGIT(line[1]) || !ISDIGIT(line[2]))
    return FALSE;

  /* Do we have a command response? This should be the response code followed
     by a space and optionally some text as per RFC-5321 and as outlined in
     Section 4. Examples of RFC-4954 but some e-mail servers ignore this and
     only send the response code instead as per Section 4.2. */
  if(line[3] == ' ' || len == 5) {
    char tmpline[6];

    result = TRUE;
    memset(tmpline, '\0', sizeof(tmpline));
    memcpy(tmpline, line, (len == 5 ? 5 : 3));
    *resp = curlx_sltosi(strtol(tmpline, NULL, 10));

    /* Make sure real server never sends internal value */
    if(*resp == 1)
      *resp = 0;
  }
  /* Do we have a multiline (continuation) response? */
  else if(line[3] == '-' &&
          (smtpc->state == SMTP_EHLO || smtpc->state == SMTP_COMMAND)) {
    result = TRUE;
    *resp = 1;  /* Internal response code */
  }

  return result;
}